

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O1

duckdb_logical_type
duckdb_create_union_type(duckdb_logical_type *member_types_p,char **member_names,idx_t member_count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 *puVar1;
  size_type sVar2;
  undefined8 uVar3;
  LogicalType *pLVar4;
  element_type *peVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  child_list_t<duckdb::LogicalType> members;
  allocator local_d1;
  LogicalType *local_d0;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_a0;
  child_list_t<LogicalType> local_68;
  char *local_50;
  LogicalType local_48;
  
  if (member_names == (char **)0x0 || member_types_p == (duckdb_logical_type *)0x0) {
    pLVar4 = (LogicalType *)0x0;
  }
  else {
    local_c8 = (element_type *)member_count;
    local_d0 = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(local_d0);
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_c8 != (element_type *)0x0) {
      peVar5 = (element_type *)0x0;
      do {
        local_50 = member_names[(long)peVar5];
        duckdb::LogicalType::LogicalType(&local_48,(LogicalType *)member_types_p[(long)peVar5]);
        std::__cxx11::string::string((string *)&local_a0,local_50,&local_d1);
        duckdb::LogicalType::LogicalType(&local_a0.second,&local_48);
        std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_b8,&local_a0);
        duckdb::LogicalType::~LogicalType(&local_a0.second);
        puVar1 = (undefined1 *)
                 CONCAT62(local_a0.first._M_dataplus._M_p._2_6_,
                          CONCAT11(local_a0.first._M_dataplus._M_p._1_1_,
                                   (LogicalTypeId)local_a0.first._M_dataplus._M_p));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar1 != &local_a0.first.field_2) {
          operator_delete(puVar1);
        }
        duckdb::LogicalType::~LogicalType(&local_48);
        peVar5 = (element_type *)((long)&peVar5->_vptr_ExtraTypeInfo + 1);
      } while (local_c8 != peVar5);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_68,&local_b8);
    duckdb::LogicalType::UNION((LogicalType *)&local_a0,&local_68);
    uVar3 = local_a0.first.field_2._M_allocated_capacity;
    sVar2 = local_a0.first._M_string_length;
    pLVar4 = local_d0;
    local_d0->id_ = (LogicalTypeId)local_a0.first._M_dataplus._M_p;
    local_d0->physical_type_ = local_a0.first._M_dataplus._M_p._1_1_;
    uVar6 = *(undefined4 *)
             &(local_d0->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar7 = *(undefined4 *)
             ((long)&(local_d0->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             4);
    peVar5 = (local_d0->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar8 = *(undefined4 *)
             &(local_d0->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    uVar9 = *(undefined4 *)
             ((long)&(local_d0->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4);
    (local_d0->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_d0->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.first._M_string_length = 0;
    local_a0.first.field_2._M_allocated_capacity = 0;
    this = (local_d0->type_info_).internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (local_d0->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar2;
    (local_d0->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_c8 = peVar5;
      uStack_c0 = uVar8;
      uStack_bc = uVar9;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      uVar6 = (undefined4)local_c8;
      uVar7 = local_c8._4_4_;
      uVar8 = uStack_c0;
      uVar9 = uStack_bc;
    }
    uVar3 = local_a0.first.field_2._M_allocated_capacity;
    local_a0.first._M_string_length = CONCAT44(uVar7,uVar6);
    local_a0.first.field_2._M_allocated_capacity._4_4_ = uVar9;
    local_a0.first.field_2._M_allocated_capacity._0_4_ = uVar8;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_a0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_68);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_b8);
  }
  return (duckdb_logical_type)pLVar4;
}

Assistant:

duckdb_logical_type duckdb_create_union_type(duckdb_logical_type *member_types_p, const char **member_names,
                                             idx_t member_count) {
	if (!member_types_p || !member_names) {
		return nullptr;
	}
	duckdb::LogicalType **member_types = reinterpret_cast<duckdb::LogicalType **>(member_types_p);
	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	duckdb::child_list_t<duckdb::LogicalType> members;

	for (idx_t i = 0; i < member_count; i++) {
		members.push_back(make_pair(member_names[i], *member_types[i]));
	}
	*mtype = duckdb::LogicalType::UNION(members);
	return reinterpret_cast<duckdb_logical_type>(mtype);
}